

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sensitive.cc
# Opt level: O3

void COST_SENSITIVE::parse_label(parser *p,shared_data *sd,void *v,v_array<substring> *words)

{
  COST_SENSITIVE *this;
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  undefined7 extraout_var;
  substring *psVar6;
  long lVar7;
  ostream *poVar9;
  vw_exception *pvVar10;
  char *pcVar11;
  substring *s;
  uint uVar12;
  ulong uVar13;
  substring ss;
  substring ss_00;
  substring ss_01;
  substring ss_02;
  float fx;
  wclass f;
  wclass local_218;
  substring *local_208;
  shared_data *local_200;
  string local_1f8;
  string local_1d8;
  wclass local_1b8;
  ostream local_1a8;
  uint64_t uVar8;
  
  v_array<COST_SENSITIVE::wclass>::clear((v_array<COST_SENSITIVE::wclass> *)v);
  s = words->_begin;
  psVar6 = words->_end;
  pcVar11 = (char *)((long)psVar6 - (long)s);
  local_200 = sd;
  if (pcVar11 == (char *)0x10) {
    name_value(s,&p->parse_name,&local_218.x);
    local_208 = (p->parse_name)._begin;
    this = (COST_SENSITIVE *)local_208->begin;
    pcVar1 = local_208->end;
    ss.end = "***shared***";
    ss.begin = pcVar1;
    bVar2 = substring_eq(this,ss,pcVar11);
    ss_00.end = "***label***";
    ss_00.begin = pcVar1;
    bVar3 = substring_eq(this,ss_00,pcVar11);
    pcVar11 = (char *)(CONCAT71(extraout_var,bVar3) & 0xffffffff);
    if (sd->ldict == (namedlabels *)0x0) {
      ss_01.end = "shared";
      ss_01.begin = pcVar1;
      bVar4 = substring_eq(this,ss_01,pcVar11);
      bVar2 = bVar2 || bVar4;
      ss_02.end = "label";
      ss_02.begin = pcVar1;
      bVar4 = substring_eq(this,ss_02,pcVar11);
      pcVar11 = (char *)(ulong)(bVar3 || bVar4);
    }
    if ((byte)((byte)pcVar11 | bVar2) == 1) {
      if (bVar2 != false) {
        if ((long)(p->parse_name)._end - (long)local_208 == 0x10) {
          local_1b8.x = -3.4028235e+38;
          local_1b8.class_index = 0;
          local_1b8.partial_prediction = 0.0;
          local_1b8.wap_value = 0.0;
          v_array<COST_SENSITIVE::wclass>::push_back
                    ((v_array<COST_SENSITIVE::wclass> *)v,&local_1b8);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"shared feature vectors should not have costs on: ",0x31)
          ;
          poVar9 = ::operator<<((ostream *)&std::cerr,words->_begin);
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
        }
      }
      if ((byte)pcVar11 == 0) {
        return;
      }
      psVar6 = (p->parse_name)._begin;
      if ((long)(p->parse_name)._end - (long)psVar6 == 0x20) {
        local_1b8.x = float_of_substring(psVar6[1]);
        local_1b8.class_index = 0;
        local_1b8.partial_prediction = 0.0;
        local_1b8.wap_value = 0.0;
        v_array<COST_SENSITIVE::wclass>::push_back((v_array<COST_SENSITIVE::wclass> *)v,&local_1b8);
        return;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"label feature vectors should have exactly one cost on: ",
                 0x37);
      poVar9 = ::operator<<((ostream *)&std::cerr,words->_begin);
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      return;
    }
    s = words->_begin;
    psVar6 = words->_end;
  }
  if (psVar6 != s) {
    uVar12 = 1;
    uVar13 = 0;
    do {
      local_218.x = 0.0;
      local_218.class_index = 0;
      local_218.partial_prediction = 0.0;
      local_218.wap_value = 0.0;
      name_value(s + uVar13,&p->parse_name,&local_218.x);
      psVar6 = (p->parse_name)._begin;
      lVar7 = (long)(p->parse_name)._end - (long)psVar6 >> 4;
      if (2 < lVar7 - 1U) {
        if (lVar7 == 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&local_1a8," invalid cost: specification -- no names on: ",0x2d);
          ::operator<<(&local_1a8,words->_begin + uVar13);
          pvVar10 = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (pvVar10,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cost_sensitive.cc"
                     ,0xb4,&local_1d8);
          __cxa_throw(pvVar10,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_1a8,"malformed cost specification on \'",0x21);
        poVar9 = std::operator<<(&local_1a8,((p->parse_name)._begin)->begin);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\'",1);
        pvVar10 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar10,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cost_sensitive.cc"
                   ,0xbe,&local_1f8);
        __cxa_throw(pvVar10,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      if (local_200->ldict == (namedlabels *)0x0) {
        uVar8 = hashstring(*psVar6,0);
        uVar5 = (uint32_t)uVar8;
      }
      else {
        uVar8 = namedlabels::get(local_200->ldict,psVar6);
        uVar5 = (uint32_t)uVar8;
      }
      local_218.class_index = uVar5;
      if (((long)(p->parse_name)._end - (long)(p->parse_name)._begin == 0x10) &&
         (0.0 <= local_218.x)) {
        local_218.x = 3.4028235e+38;
      }
      v_array<COST_SENSITIVE::wclass>::push_back((v_array<COST_SENSITIVE::wclass> *)v,&local_218);
      uVar13 = (ulong)uVar12;
      s = words->_begin;
      uVar12 = uVar12 + 1;
    } while (uVar13 < (ulong)((long)words->_end - (long)s >> 4));
  }
  return;
}

Assistant:

void parse_label(parser* p, shared_data* sd, void* v, v_array<substring>& words)
{
  label* ld = (label*)v;
  ld->costs.clear();

  // handle shared and label first
  if (words.size() == 1)
  {
    float fx;
    name_value(words[0], p->parse_name, fx);
    bool eq_shared = substring_eq(p->parse_name[0], "***shared***");
    bool eq_label = substring_eq(p->parse_name[0], "***label***");
    if (!sd->ldict)
    {
      eq_shared |= substring_eq(p->parse_name[0], "shared");
      eq_label |= substring_eq(p->parse_name[0], "label");
    }
    if (eq_shared || eq_label)
    {
      if (eq_shared)
      {
        if (p->parse_name.size() != 1)
          cerr << "shared feature vectors should not have costs on: " << words[0] << endl;
        else
        {
          wclass f = {-FLT_MAX, 0, 0., 0.};
          ld->costs.push_back(f);
        }
      }
      if (eq_label)
      {
        if (p->parse_name.size() != 2)
          cerr << "label feature vectors should have exactly one cost on: " << words[0] << endl;
        else
        {
          wclass f = {float_of_substring(p->parse_name[1]), 0, 0., 0.};
          ld->costs.push_back(f);
        }
      }
      return;
    }
  }

  // otherwise this is a "real" example
  for (unsigned int i = 0; i < words.size(); i++)
  {
    wclass f = {0., 0, 0., 0.};
    name_value(words[i], p->parse_name, f.x);

    if (p->parse_name.size() == 0)
      THROW(" invalid cost: specification -- no names on: " << words[i]);

    if (p->parse_name.size() == 1 || p->parse_name.size() == 2 || p->parse_name.size() == 3)
    {
      f.class_index =
          sd->ldict ? (uint32_t)sd->ldict->get(p->parse_name[0]) : (uint32_t)hashstring(p->parse_name[0], 0);
      if (p->parse_name.size() == 1 && f.x >= 0)  // test examples are specified just by un-valued class #s
        f.x = FLT_MAX;
    }
    else
      THROW("malformed cost specification on '" << (p->parse_name[0].begin) << "'");

    ld->costs.push_back(f);
  }
}